

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferMapTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::BufferPartialMapWriteCase::BufferPartialMapWriteCase
          (BufferPartialMapWriteCase *this,Context *context,char *name,char *desc,
          deUint32 bufferTarget,deUint32 usage,int bufferSize,int mapOffset,int mapSize,
          VerifyType verify)

{
  deqp::gls::BufferTestUtil::BufferCase::BufferCase
            (&this->super_BufferCase,context->m_testCtx,context->m_renderCtx,name,desc);
  (this->super_BufferCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BufferCase_01e42c28;
  this->m_bufferTarget = bufferTarget;
  this->m_usage = usage;
  this->m_bufferSize = bufferSize;
  this->m_mapOffset = mapOffset;
  this->m_mapSize = mapSize;
  this->m_verify = verify;
  return;
}

Assistant:

BufferPartialMapWriteCase (Context& context, const char* name, const char* desc, deUint32 bufferTarget, deUint32 usage, int bufferSize, int mapOffset, int mapSize, VerifyType verify)
		: BufferCase		(context.getTestContext(), context.getRenderContext(), name, desc)
		, m_bufferTarget	(bufferTarget)
		, m_usage			(usage)
		, m_bufferSize		(bufferSize)
		, m_mapOffset		(mapOffset)
		, m_mapSize			(mapSize)
		, m_verify			(verify)
	{
	}